

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::IndexPropertyDescriptorMap::Add
          (IndexPropertyDescriptorMap *this,uint32 key,IndexPropertyDescriptor *value)

{
  int iVar1;
  BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar2;
  nullptr_t local_28;
  IndexPropertyDescriptor *local_20;
  IndexPropertyDescriptor *value_local;
  IndexPropertyDescriptorMap *pIStack_10;
  uint32 key_local;
  IndexPropertyDescriptorMap *this_local;
  
  local_20 = value;
  value_local._4_4_ = key;
  pIStack_10 = this;
  pBVar2 = Memory::
           WriteBarrierPtr<JsUtil::BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
           ::operator->(&this->indexPropertyMap);
  iVar1 = JsUtil::
          BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::Count(pBVar2);
  if (0x3ffffffe < iVar1) {
    Throw::OutOfMemory();
  }
  local_28 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<unsigned_int>::operator=(&this->indexList,&local_28);
  pBVar2 = Memory::
           WriteBarrierPtr<JsUtil::BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
           ::operator->(&this->indexPropertyMap);
  JsUtil::
  BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Add(pBVar2,(uint *)((long)&value_local + 4),local_20);
  return;
}

Assistant:

void IndexPropertyDescriptorMap::Add(uint32 key, const IndexPropertyDescriptor& value)
    {
        if (indexPropertyMap->Count() >= (INT_MAX / 2))
        {
            Js::Throw::OutOfMemory(); // Would possibly overflow our dictionary
        }

        indexList = nullptr; // Discard indexList on change
        indexPropertyMap->Add(key, value);
    }